

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

void __thiscall LiteScript::Class::Class(Class *this,Class *c)

{
  long lVar1;
  
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
            (&this->inherit,&c->inherit);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::vector(&this->s_members,&c->s_members);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::vector(&this->us_members,&c->us_members);
  std::array<LiteScript::Nullable<LiteScript::Variable>,_33UL>::array
            (&this->op_members,&c->op_members);
  this->constructor_index = c->constructor_index;
  this->memory = c->memory;
  for (lVar1 = 0; lVar1 != 0x420; lVar1 = lVar1 + 0x20) {
    (this->op_members)._M_elems[0].data[lVar1 + 0x10] = '\x01';
    *(char **)((this->op_members)._M_elems[0].data + lVar1 + 0x18) =
         (this->op_members)._M_elems[0].data + lVar1 + 0x10;
  }
  return;
}

Assistant:

LiteScript::Class::Class(const Class &c) :
    inherit(c.inherit), s_members(c.s_members), us_members(c.us_members), op_members(c.op_members),
    memory(c.memory), constructor_index(c.constructor_index)
{
    std::allocator<Nullable<Variable>> allocator;
    for (unsigned int i = 0; i < (unsigned int)OperatorType::OP_TYPE_NUMBER; i++)
        allocator.construct(&this->op_members[i]);
}